

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *addr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ushort uVar4;
  uint uVar5;
  BVIndex i;
  
  uVar5 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  uVar4 = this->objectSize;
  if (uVar5 % (uint)uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    uVar4 = this->objectSize;
    uVar5 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  }
  i = uVar5 >> 3;
  uVar5 = (uint)(uVar4 >> 3);
  while (bVar2 = uVar5 != 0, uVar5 = uVar5 - 1, bVar2) {
    BVStatic<4096UL>::TestAndClearInterlocked(&this->wbVerifyBits,i);
    i = i + 1;
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }